

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VoxWriter.cpp
# Opt level: O3

void __thiscall
vox::VoxWriter::AddColor(VoxWriter *this,uint8_t *r,uint8_t *g,uint8_t *b,uint8_t *a,uint8_t *index)

{
  pointer piVar1;
  ulong uVar2;
  iterator __position;
  int local_44;
  uint8_t *local_40;
  uint8_t *local_38;
  
  piVar1 = (this->colors).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  __position._M_current =
       (this->colors).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  uVar2 = (ulong)*index;
  local_40 = b;
  local_38 = a;
  if ((ulong)((long)__position._M_current - (long)piVar1 >> 2) <= uVar2) {
    do {
      local_44 = 0;
      if (__position._M_current ==
          (this->colors).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (&this->colors,__position,&local_44);
        piVar1 = (this->colors).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        __position._M_current =
             (this->colors).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
      }
      else {
        *__position._M_current = 0;
        __position._M_current = __position._M_current + 1;
        (this->colors).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
        ._M_finish = __position._M_current;
      }
      uVar2 = (ulong)*index;
    } while ((ulong)((long)__position._M_current - (long)piVar1 >> 2) <= uVar2);
  }
  piVar1[uVar2] = CONCAT13(*local_38,CONCAT12(*local_40,CONCAT11(*g,*r)));
  return;
}

Assistant:

void VoxWriter::AddColor(const uint8_t& r, const uint8_t& g, const uint8_t& b, const uint8_t& a, const uint8_t& index) {
    while (colors.size() <= index)
        colors.push_back(0);
    colors[index] = GetID(r, g, b, a);
}